

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_BOOL opj_tcd_rateallocate
                   (opj_tcd_t *tcd,OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 len,
                   opj_codestream_info_t *cstr_info,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  opj_cp_t *p_cp;
  opj_tcd_tile_t *p_tile;
  opj_tcp_t *poVar8;
  opj_tcd_tilecomp_t *poVar9;
  opj_tcd_resolution_t *poVar10;
  opj_tcd_precinct_t *poVar11;
  opj_tcd_cblk_enc_t *poVar12;
  opj_tcd_pass_t *poVar13;
  opj_tile_info_t *poVar14;
  double dVar15;
  OPJ_FLOAT64 OVar16;
  double dVar17;
  double dVar18;
  OPJ_BOOL OVar19;
  ulong uVar20;
  double *pdVar21;
  opj_t2_t *t2;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  OPJ_UINT32 OVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  bool bVar31;
  float fVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double thresh;
  double dVar38;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  OPJ_UINT32 local_3c8;
  double local_398;
  double local_388;
  OPJ_FLOAT64 cumdisto [100];
  
  p_cp = tcd->cp;
  p_tile = tcd->tcd_image->tiles;
  poVar8 = tcd->tcp;
  p_tile->numpix = 0;
  uVar2 = p_tile->numcomps;
  dVar34 = 1.79769313486232e+308;
  local_388 = 0.0;
  iVar30 = 0;
  dVar36 = 0.0;
  for (uVar24 = 0; uVar24 != uVar2; uVar24 = uVar24 + 1) {
    poVar9 = p_tile->comps;
    poVar9[uVar24].numpix = 0;
    uVar3 = poVar9[uVar24].numresolutions;
    iVar25 = 0;
    for (uVar23 = 0; uVar23 != uVar3; uVar23 = uVar23 + 1) {
      poVar10 = poVar9[uVar24].resolutions;
      uVar4 = poVar10[uVar23].numbands;
      for (uVar20 = 0; uVar20 != uVar4; uVar20 = uVar20 + 1) {
        OVar19 = opj_tcd_is_band_empty(poVar10[uVar23].bands + uVar20);
        if (OVar19 == 0) {
          OVar26 = poVar10[uVar23].ph;
          OVar5 = poVar10[uVar23].pw;
          for (uVar22 = 0; uVar22 != OVar26 * OVar5; uVar22 = uVar22 + 1) {
            poVar11 = poVar10[uVar23].bands[uVar20].precincts;
            OVar6 = poVar11[uVar22].ch;
            OVar7 = poVar11[uVar22].cw;
            for (uVar27 = 0; uVar27 != OVar6 * OVar7; uVar27 = uVar27 + 1) {
              poVar12 = poVar11[uVar22].cblks.enc;
              for (lVar28 = 0; (ulong)poVar12[uVar27].totalpasses * 0x18 - lVar28 != 0;
                  lVar28 = lVar28 + 0x18) {
                poVar13 = poVar12[uVar27].passes;
                iVar29 = *(int *)((long)&poVar13->rate + lVar28);
                if (lVar28 == 0) {
                  dVar15 = (double)poVar13->distortiondec;
                }
                else {
                  iVar29 = iVar29 - *(int *)((long)&poVar13[-1].rate + lVar28);
                  dVar15 = *(double *)((long)&poVar13->distortiondec + lVar28) -
                           *(double *)((long)poVar13 + lVar28 + -0x10);
                }
                dVar37 = dVar36;
                if (iVar29 != 0) {
                  dVar37 = dVar15 / (double)iVar29;
                  dVar15 = dVar37;
                  if (dVar34 <= dVar37) {
                    dVar15 = dVar34;
                  }
                  dVar34 = dVar15;
                  if (dVar37 <= dVar36) {
                    dVar37 = dVar36;
                  }
                }
                dVar36 = dVar37;
              }
              iVar29 = (poVar12[uVar27].y1 - poVar12[uVar27].y0) *
                       (poVar12[uVar27].x1 - poVar12[uVar27].x0);
              iVar30 = iVar30 + iVar29;
              p_tile->numpix = iVar30;
              iVar25 = iVar25 + iVar29;
              poVar9[uVar24].numpix = iVar25;
            }
          }
        }
      }
    }
    dVar15 = (double)(1 << ((byte)tcd->image->comps[uVar24].prec & 0x1f)) + -1.0;
    local_388 = local_388 + (double)iVar25 * dVar15 * dVar15;
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    poVar14 = cstr_info->tile;
    uVar2 = tcd->tcd_tileno;
    poVar14[uVar2].numpix = iVar30;
    poVar14[uVar2].distotile = (double)p_tile->distotile;
    pdVar21 = (double *)opj_malloc((ulong)poVar8->numlayers << 3);
    poVar14[uVar2].thresh = pdVar21;
    if (pdVar21 == (double *)0x0) {
      return 0;
    }
  }
  uVar24 = 0;
  do {
    if (poVar8->numlayers <= uVar24) {
      return 1;
    }
    local_3c8 = len;
    if (0.0 < (float)poVar8->rates[uVar24]) {
      fVar32 = ceilf((float)poVar8->rates[uVar24]);
      local_3c8 = (OPJ_UINT32)(long)fVar32;
      if (len <= local_3c8) {
        local_3c8 = len;
      }
    }
    dVar15 = (double)p_tile->distotile;
    dVar37 = pow(10.0,(double)((float)poVar8->distoratio[uVar24] / 10.0));
    bVar1 = *(byte *)((long)&p_cp->m_specific_param + 0x11);
    OVar26 = (OPJ_UINT32)uVar24;
    if (((bVar1 & 1) == 0) || ((float)poVar8->rates[uVar24] <= 0.0)) {
      local_3e8 = 0;
      uStack_3e4 = 0xbff00000;
      if ((bVar1 & 4) != 0) {
        local_3e8 = 0;
        uStack_3e4 = 0xbff00000;
        if (0.0 < (float)poVar8->distoratio[uVar24]) goto LAB_0013360d;
      }
    }
    else {
LAB_0013360d:
      t2 = opj_t2_create(tcd->image,p_cp);
      if (t2 == (opj_t2_t *)0x0) {
        return 0;
      }
      local_398 = 0.0;
      iVar30 = 0x80;
      thresh = 0.0;
      dVar17 = dVar34;
      dVar18 = dVar36;
LAB_0013367d:
      while (dVar33 = dVar18, dVar38 = dVar17, bVar31 = iVar30 != 0, iVar30 = iVar30 + -1, bVar31) {
        thresh = (dVar38 + dVar33) * 0.5;
        opj_tcd_makelayer(tcd,OVar26,(OPJ_FLOAT64)thresh,0);
        dVar17 = thresh;
        dVar18 = dVar33;
        if ((*(byte *)((long)&p_cp->m_specific_param + 0x11) & 4) != 0) {
          if ((ushort)((short)*(undefined4 *)p_cp - 3U) < 4) goto code_r0x0013374e;
          if (uVar24 == 0) {
            OVar16 = p_tile->distolayer[0];
          }
          else {
            OVar16 = (OPJ_FLOAT64)
                     ((double)cumdisto[OVar26 - 1] + (double)p_tile->distolayer[uVar24]);
          }
          goto LAB_00133811;
        }
        OVar19 = opj_t2_encode_packets
                           (t2,tcd->tcd_tileno,p_tile,OVar26 + 1,dest,p_data_written,local_3c8,
                            cstr_info,tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,THRESH_CALC,
                            p_manager);
        dVar35 = thresh;
        dVar33 = thresh;
        if (OVar19 != 0) goto LAB_0013383f;
      }
      uVar23 = ~-(ulong)(local_398 == 0.0) & (ulong)local_398 |
               (ulong)thresh & -(ulong)(local_398 == 0.0);
      opj_t2_destroy(t2);
      local_3e8 = (undefined4)uVar23;
      uStack_3e4 = (undefined4)(uVar23 >> 0x20);
    }
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      cstr_info->tile[tcd->tcd_tileno].thresh[uVar24] = (double)CONCAT44(uStack_3e4,local_3e8);
    }
    opj_tcd_makelayer(tcd,OVar26,(OPJ_FLOAT64)CONCAT44(uStack_3e4,local_3e8),1);
    if (uVar24 == 0) {
      OVar16 = p_tile->distolayer[0];
    }
    else {
      OVar16 = (OPJ_FLOAT64)((double)cumdisto[uVar24 - 1] + (double)p_tile->distolayer[uVar24]);
    }
    cumdisto[uVar24] = OVar16;
    uVar24 = uVar24 + 1;
  } while( true );
code_r0x0013374e:
  OVar19 = opj_t2_encode_packets
                     (t2,tcd->tcd_tileno,p_tile,OVar26 + 1,dest,p_data_written,local_3c8,cstr_info,
                      tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,THRESH_CALC,p_manager);
  if (OVar19 != 0) {
    if (uVar24 == 0) {
      OVar16 = p_tile->distolayer[0];
    }
    else {
      OVar16 = (OPJ_FLOAT64)((double)cumdisto[OVar26 - 1] + (double)p_tile->distolayer[uVar24]);
    }
LAB_00133811:
    dVar35 = local_398;
    dVar17 = dVar38;
    dVar18 = thresh;
    local_398 = thresh;
    dVar38 = thresh;
    if (dVar15 - local_388 / dVar37 <= (double)OVar16) {
LAB_0013383f:
      dVar17 = dVar38;
      dVar18 = dVar33;
      local_398 = dVar35;
    }
  }
  goto LAB_0013367d;
}

Assistant:

OPJ_BOOL opj_tcd_rateallocate(opj_tcd_t *tcd,
                              OPJ_BYTE *dest,
                              OPJ_UINT32 * p_data_written,
                              OPJ_UINT32 len,
                              opj_codestream_info_t *cstr_info,
                              opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno, layno;
    OPJ_UINT32 passno;
    OPJ_FLOAT64 min, max;
    OPJ_FLOAT64 cumdisto[100];      /* fixed_quality */
    const OPJ_FLOAT64 K = 1;                /* 1.1; fixed_quality */
    OPJ_FLOAT64 maxSE = 0;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    min = DBL_MAX;
    max = 0;

    tcd_tile->numpix = 0;           /* fixed_quality */

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];
        tilec->numpix = 0;

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];

                        for (passno = 0; passno < cblk->totalpasses; passno++) {
                            opj_tcd_pass_t *pass = &cblk->passes[passno];
                            OPJ_INT32 dr;
                            OPJ_FLOAT64 dd, rdslope;

                            if (passno == 0) {
                                dr = (OPJ_INT32)pass->rate;
                                dd = pass->distortiondec;
                            } else {
                                dr = (OPJ_INT32)(pass->rate - cblk->passes[passno - 1].rate);
                                dd = pass->distortiondec - cblk->passes[passno - 1].distortiondec;
                            }

                            if (dr == 0) {
                                continue;
                            }

                            rdslope = dd / dr;
                            if (rdslope < min) {
                                min = rdslope;
                            }

                            if (rdslope > max) {
                                max = rdslope;
                            }
                        } /* passno */

                        /* fixed_quality */
                        tcd_tile->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                        tilec->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                    } /* cbklno */
                } /* precno */
            } /* bandno */
        } /* resno */

        maxSE += (((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0)
                  * ((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0))
                 * ((OPJ_FLOAT64)(tilec->numpix));
    } /* compno */

    /* index file */
    if (cstr_info) {
        opj_tile_info_t *tile_info = &cstr_info->tile[tcd->tcd_tileno];
        tile_info->numpix = tcd_tile->numpix;
        tile_info->distotile = tcd_tile->distotile;
        tile_info->thresh = (OPJ_FLOAT64 *) opj_malloc(tcd_tcp->numlayers * sizeof(
                                OPJ_FLOAT64));
        if (!tile_info->thresh) {
            /* FIXME event manager error callback */
            return OPJ_FALSE;
        }
    }

    for (layno = 0; layno < tcd_tcp->numlayers; layno++) {
        OPJ_FLOAT64 lo = min;
        OPJ_FLOAT64 hi = max;
        OPJ_UINT32 maxlen = tcd_tcp->rates[layno] > 0.0f ? opj_uint_min(((
                                OPJ_UINT32) ceil(tcd_tcp->rates[layno])), len) : len;
        OPJ_FLOAT64 goodthresh = 0;
        OPJ_FLOAT64 stable_thresh = 0;
        OPJ_UINT32 i;
        OPJ_FLOAT64 distotarget;                /* fixed_quality */

        /* fixed_quality */
        distotarget = tcd_tile->distotile - ((K * maxSE) / pow((OPJ_FLOAT32)10,
                                             tcd_tcp->distoratio[layno] / 10));

        /* Don't try to find an optimal threshold but rather take everything not included yet, if
          -r xx,yy,zz,0   (disto_alloc == 1 and rates == 0)
          -q xx,yy,zz,0   (fixed_quality == 1 and distoratio == 0)
          ==> possible to have some lossy layers and the last layer for sure lossless */
        if (((cp->m_specific_param.m_enc.m_disto_alloc == 1) &&
                (tcd_tcp->rates[layno] > 0.0f)) ||
                ((cp->m_specific_param.m_enc.m_fixed_quality == 1) &&
                 (tcd_tcp->distoratio[layno] > 0.0))) {
            opj_t2_t*t2 = opj_t2_create(tcd->image, cp);
            OPJ_FLOAT64 thresh = 0;

            if (t2 == 00) {
                return OPJ_FALSE;
            }

            for (i = 0; i < 128; ++i) {
                OPJ_FLOAT64 distoachieved = 0;  /* fixed_quality */

                thresh = (lo + hi) / 2;

                opj_tcd_makelayer(tcd, layno, thresh, 0);

                if (cp->m_specific_param.m_enc.m_fixed_quality) {       /* fixed_quality */
                    if (OPJ_IS_CINEMA(cp->rsiz)) {
                        if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                    p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                    THRESH_CALC, p_manager)) {

                            lo = thresh;
                            continue;
                        } else {
                            distoachieved = layno == 0 ?
                                            tcd_tile->distolayer[0] : cumdisto[layno - 1] + tcd_tile->distolayer[layno];

                            if (distoachieved < distotarget) {
                                hi = thresh;
                                stable_thresh = thresh;
                                continue;
                            } else {
                                lo = thresh;
                            }
                        }
                    } else {
                        distoachieved = (layno == 0) ?
                                        tcd_tile->distolayer[0] : (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);

                        if (distoachieved < distotarget) {
                            hi = thresh;
                            stable_thresh = thresh;
                            continue;
                        }
                        lo = thresh;
                    }
                } else {
                    if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                THRESH_CALC, p_manager)) {
                        /* TODO: what to do with l ??? seek / tell ??? */
                        /* opj_event_msg(tcd->cinfo, EVT_INFO, "rate alloc: len=%d, max=%d\n", l, maxlen); */
                        lo = thresh;
                        continue;
                    }

                    hi = thresh;
                    stable_thresh = thresh;
                }
            }

            goodthresh = stable_thresh == 0 ? thresh : stable_thresh;

            opj_t2_destroy(t2);
        } else {
            /* Special value to indicate to use all passes */
            goodthresh = -1;
        }

        if (cstr_info) { /* Threshold for Marcela Index */
            cstr_info->tile[tcd->tcd_tileno].thresh[layno] = goodthresh;
        }

        opj_tcd_makelayer(tcd, layno, goodthresh, 1);

        /* fixed_quality */
        cumdisto[layno] = (layno == 0) ? tcd_tile->distolayer[0] :
                          (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);
    }

    return OPJ_TRUE;
}